

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

void GPU_SetShapeBlendFunction
               (GPU_BlendFuncEnum source_color,GPU_BlendFuncEnum dest_color,
               GPU_BlendFuncEnum source_alpha,GPU_BlendFuncEnum dest_alpha)

{
  GPU_Context *pGVar1;
  
  if ((_gpu_current_renderer != (GPU_Renderer *)0x0) &&
     (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0)) {
    pGVar1 = _gpu_current_renderer->current_context_target->context;
    (pGVar1->shapes_blend_mode).source_color = source_color;
    (pGVar1->shapes_blend_mode).dest_color = dest_color;
    (pGVar1->shapes_blend_mode).source_alpha = source_alpha;
    (pGVar1->shapes_blend_mode).dest_alpha = dest_alpha;
  }
  return;
}

Assistant:

void GPU_SetShapeBlendFunction(GPU_BlendFuncEnum source_color, GPU_BlendFuncEnum dest_color, GPU_BlendFuncEnum source_alpha, GPU_BlendFuncEnum dest_alpha)
{
    GPU_Context* context;
    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
        return;

    context = _gpu_current_renderer->current_context_target->context;

    context->shapes_blend_mode.source_color = source_color;
    context->shapes_blend_mode.dest_color = dest_color;
    context->shapes_blend_mode.source_alpha = source_alpha;
    context->shapes_blend_mode.dest_alpha = dest_alpha;
}